

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapRegexInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapRegexInfo *pSVar2;
  Var lastVar;
  RecyclableObject *pRVar3;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapRegexInfo*,(TTD::NSSnapObjects::SnapObjectType)17>
                     (snpObject);
  if (pSVar2->LastIndexVar == (TTDVar)0x0) {
    lastVar = (Var)0x0;
  }
  else {
    lastVar = InflateMap::InflateTTDVar(inflator,pSVar2->LastIndexVar);
  }
  pRVar3 = Js::JavascriptLibrary::CreateRegex_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                      (pSVar2->RegexStr).Contents,(pSVar2->RegexStr).Length,pSVar2->Flags,
                      pSVar2->LastIndexOrFlag,lastVar);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapRegexInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Regexes are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapRegexInfo* regexInfo = SnapObjectGetAddtlInfoAs<SnapRegexInfo*, SnapObjectType::SnapRegexObject>(snpObject);

            Js::Var lastVar = (regexInfo->LastIndexVar != nullptr) ? inflator->InflateTTDVar(regexInfo->LastIndexVar) : nullptr;

            return ctx->GetLibrary()->CreateRegex_TTD(regexInfo->RegexStr.Contents, regexInfo->RegexStr.Length, regexInfo->Flags, regexInfo->LastIndexOrFlag, lastVar);
        }